

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void nmea_sentence_received(char *sentence,uint length,uchar sentences,uchar sentencenum)

{
  uint uVar1;
  ssize_t sVar2;
  undefined7 in_register_00000011;
  uint uVar3;
  
  if ((int)CONCAT71(in_register_00000011,sentences) == 1) {
    sVar2 = sendto(sock,sentence,(ulong)length,0,(sockaddr *)addr->ai_addr,addr->ai_addrlen);
    if (sVar2 == -1) {
LAB_0010268b:
      abort();
    }
    if (debug_nmea == '\x01') {
      fputs(sentence,_stderr);
      return;
    }
  }
  else {
    uVar3 = buffer_count + length;
    uVar1 = 0;
    if (uVar3 < 0x800) {
      memcpy(buffer + buffer_count,sentence,(ulong)length);
      uVar1 = uVar3;
    }
    buffer_count = uVar1;
    if (uVar1 != 0 && sentences == sentencenum) {
      sVar2 = sendto(sock,buffer,(ulong)uVar1,0,(sockaddr *)addr->ai_addr,addr->ai_addrlen);
      if (sVar2 == -1) goto LAB_0010268b;
      if (debug_nmea == '\x01') {
        fputs(buffer,_stderr);
      }
      buffer_count = 0;
    }
  }
  return;
}

Assistant:

void nmea_sentence_received(const char *sentence,
                          unsigned int length,
                          unsigned char sentences,
                          unsigned char sentencenum) {
    if (sentences == 1) {
        if (sendto(sock, sentence, length, 0, addr->ai_addr, addr->ai_addrlen) == -1) abort();
        if (debug_nmea) fprintf(stderr, "%s", sentence);
    } else {
        if (buffer_count + length < MAX_BUFFER_LENGTH) {
            memcpy(&buffer[buffer_count], sentence, length);
            buffer_count += length;
        } else {
            buffer_count=0;
        }

        if (sentences == sentencenum && buffer_count > 0) {
            if (sendto(sock, buffer, buffer_count, 0, addr->ai_addr, addr->ai_addrlen) == -1) abort();
            if (debug_nmea) fprintf(stderr, "%s", buffer);
            buffer_count=0;
        };
    }
}